

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

int Pla_ManDist1Num(Pla_Man_t *p)

{
  int iVar1;
  word *p_00;
  word *q;
  int local_30;
  int Count;
  int Dist;
  int k;
  int i;
  word *pCube2;
  word *pCube1;
  Pla_Man_t *p_local;
  
  local_30 = 0;
  for (Dist = 0; iVar1 = Pla_ManCubeNum(p), Dist < iVar1; Dist = Dist + 1) {
    p_00 = Pla_CubeIn(p,Dist);
    Count = Dist;
    while( true ) {
      Count = Count + 1;
      iVar1 = Pla_ManCubeNum(p);
      if (iVar1 <= Count) break;
      q = Pla_CubeIn(p,Count);
      iVar1 = Pla_CubesAreDistance1(p_00,q,p->nInWords);
      local_30 = (uint)(iVar1 == 1) + local_30;
    }
  }
  return local_30;
}

Assistant:

int Pla_ManDist1Num( Pla_Man_t * p )
{
    word * pCube1, * pCube2; 
    int i, k, Dist, Count = 0;
    Pla_ForEachCubeIn( p, pCube1, i )
    Pla_ForEachCubeInStart( p, pCube2, k, i+1 )
    {
        Dist = Pla_CubesAreDistance1( pCube1, pCube2, p->nInWords );
//        Dist = Pla_CubesAreConsensus( pCube1, pCube2, p->nInWords, NULL );
        Count += (Dist == 1);
    }
    return Count;
}